

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvs.c
# Opt level: O3

LispPTR values_list(int arg_count,LispPTR *args)

{
  byte bVar1;
  FX2 *pFVar2;
  ByteCode *pBVar3;
  uint uVar4;
  LispPTR LVar5;
  FX2 *frame;
  ulong uVar6;
  FX2 *returner;
  ByteCode *pBVar7;
  fnhead *pfVar8;
  FX2 *pFVar9;
  int local_44;
  
  pFVar9 = (FX2 *)(MachineState.pvar + -10);
  local_44 = 0;
  pFVar2 = pFVar9;
  returner = (FX2 *)0x0;
LAB_0012f2c6:
  frame = pFVar2;
  if (frame == pFVar9) {
    pBVar7 = MachineState.currentpc + 3;
    pfVar8 = MachineState.currentfunc;
  }
  else {
    uVar6 = (ulong)(frame->fnheader & 0xfffffff);
    if ((frame->fnheader & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar6);
    }
    pBVar7 = (ByteCode *)((long)&((fnhead *)(Lisp_world + uVar6))->na + (ulong)frame->pc);
    pfVar8 = (fnhead *)(Lisp_world + uVar6);
  }
LAB_0012f33f:
  while( true ) {
    bVar1 = *(byte *)((ulong)pBVar7 ^ 3);
    if (0x3e < bVar1) break;
    if (bVar1 == 9) {
      if (MVLIST_index ==
          ((uint)*(byte *)((ulong)(pBVar7 + 4) ^ 3) |
          (uint)*(byte *)((ulong)(pBVar7 + 3) ^ 3) << 8 |
          (uint)*(byte *)((ulong)(pBVar7 + 2) ^ 3) << 0x10 |
          (uint)*(byte *)((ulong)(pBVar7 + 1) ^ 3) << 0x18)) {
        if (0 < local_44) {
          simulate_unbind(frame,local_44,returner);
        }
        pBVar3 = pBVar7 + 2;
        if (frame != pFVar9) {
          frame->pc = ((short)pBVar7 - (short)pfVar8) + 5;
          pBVar3 = MachineState.currentpc;
        }
        MachineState.currentpc = pBVar3;
        return *args;
      }
      goto LAB_0012f479;
    }
    if (bVar1 == 0x10) goto LAB_0012f3e7;
    if (bVar1 != 0x12) goto LAB_0012f365;
    pBVar7 = pBVar7 + 1;
    local_44 = local_44 + 1;
  }
  if (bVar1 == 0xb0) {
    bVar1 = *(byte *)((ulong)(pBVar7 + 1) ^ 3);
    uVar6 = (ulong)bVar1 - 0x100;
    if (-1 < (char)bVar1) {
      uVar6 = (ulong)bVar1;
    }
  }
  else if (bVar1 == 0xb1) {
    bVar1 = *(byte *)((ulong)(pBVar7 + 1) ^ 3);
    uVar4 = (uint)bVar1 * 0x100 + -0x10000 + (uint)*(byte *)((ulong)(pBVar7 + 2) ^ 3);
    if (-1 < (char)bVar1) {
      uVar4 = (uint)CONCAT11(bVar1,*(byte *)((ulong)(pBVar7 + 2) ^ 3));
    }
    uVar6 = (long)(int)uVar4;
  }
  else {
    if (bVar1 == 0x3f) goto LAB_0012f3e7;
LAB_0012f365:
    if (-0x71 < (char)bVar1) {
LAB_0012f479:
      uVar4 = *args;
      if ((*(ushort *)((ulong)(uVar4 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 5) {
        return uVar4;
      }
      LVar5 = car(uVar4);
      return LVar5;
    }
    uVar6 = (ulong)(bVar1 + 2 & 0x1f);
  }
  pBVar7 = pBVar7 + uVar6;
  goto LAB_0012f33f;
LAB_0012f3e7:
  pFVar2 = (FX2 *)(Stackspace +
                  ((ulong)*(ushort *)((long)&frame->alink + (ulong)((*(uint *)frame & 1) << 4)) - 10
                  ));
  returner = frame;
  goto LAB_0012f2c6;
}

Assistant:

LispPTR values_list(int arg_count, LispPTR *args) {
  FX2 *caller, *prevcaller = 0, *immediate_caller = 0;
  ByteCode *pc;
  int unbind_count = 0;
  struct fnhead *fnhead;
  short opcode;

  caller = (FX2 *)CURRENTFX;
  immediate_caller = caller;

newframe:
  if (caller == immediate_caller) {
    fnhead = (struct fnhead *)FuncObj;
    pc = (ByteCode *)PC + 3; /* Skip over the miscn opcode we're in now */
  } else {
    fnhead = (struct fnhead *)NativeAligned4FromLAddr(POINTERMASK & SWA_FNHEAD((int)caller->fnheader));
    pc = (ByteCode *)fnhead + (caller->pc);
  }

#ifdef RESWAPPEDCODESTREAM
  if (!fnhead->byteswapped) {
    byte_swap_code_block(fnhead);
    fnhead->byteswapped = 1;
  }
#endif /* RESWAPPEDCODESTREAM */

newpc:
  opcode = (short)((unsigned char)GETBYTE((char *)pc));
  switch (opcode) {
    case opc_RETURN:
    case opc_SLRETURN:
      prevcaller = caller;
      caller = (FX2 *)(Stackspace + (int)(GETCLINK(caller)));
      goto newframe;

    case opc_FN1:
      if (MVLIST_index == Get_code_AtomNo(pc + 1)) {
        if (unbind_count > 0) simulate_unbind(caller, unbind_count, prevcaller);
/* would add 3 to PC, but miscn ret code does. */
#ifndef BIGATOMS
        if (caller == immediate_caller) PC = pc;
#else
        /* BUT 3's not enough for big atoms, so add 1 */
        if (caller == immediate_caller) PC = pc + (FN_OPCODE_SIZE - 3);
#endif /* BIGATOMS */

        else
          caller->pc = (UNSIGNED)pc + FN_OPCODE_SIZE - (UNSIGNED)fnhead;
        return (args[0]);
      }
      break;

    case opc_UNBIND:
      pc += 1;
      unbind_count += 1;
      goto newpc;

    case opc_JUMPX: {
      short displacement;
      displacement = (short)(GETBYTE((char *)pc + 1));
      if (displacement >= 128) displacement -= 256;
      pc += displacement;
      goto newpc;
    }

    case opc_JUMPXX: {
      int displacement;
      displacement = (int)Get_code_DLword(pc + 1);
      if (displacement >= 32768) displacement -= 65536;
      pc += displacement;
      goto newpc;
    }
    default:
      if ((opcode >= opc_JUMP) && (opcode < opc_FJUMP)) {
        pc += 2 + opcode - opc_JUMP;
        goto newpc;
      }
  }

  /*****************************************/
  /* Default case:  Return a single value. */
  /*****************************************/

  if (Listp(args[0]))
    return (car(args[0]));
  else
    return (args[0]);
}